

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

char * CB::bufcache_label(label *ld,char *c)

{
  size_t sVar1;
  cb_class *pcVar2;
  size_t *in_RSI;
  v_array<CB::cb_class> *in_RDI;
  size_t i;
  ulong local_18;
  size_t *local_10;
  
  sVar1 = v_array<CB::cb_class>::size(in_RDI);
  *in_RSI = sVar1;
  local_10 = in_RSI + 1;
  local_18 = 0;
  while( true ) {
    sVar1 = v_array<CB::cb_class>::size(in_RDI);
    if (sVar1 <= local_18) break;
    pcVar2 = v_array<CB::cb_class>::operator[](in_RDI,local_18);
    *local_10 = *(size_t *)pcVar2;
    local_10[1] = *(size_t *)&pcVar2->probability;
    local_10 = local_10 + 2;
    local_18 = local_18 + 1;
  }
  return (char *)local_10;
}

Assistant:

char* bufcache_label(CB::label* ld, char* c)
{
  *(size_t*)c = ld->costs.size();
  c += sizeof(size_t);
  for (size_t i = 0; i < ld->costs.size(); i++)
  {
    *(cb_class*)c = ld->costs[i];
    c += sizeof(cb_class);
  }
  return c;
}